

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update.c
# Opt level: O0

CHAR_DATA * get_rand_from_room(ROOM_INDEX_DATA *room)

{
  int iVar1;
  long in_RDI;
  int highest;
  int now;
  CHAR_DATA *victim;
  CHAR_DATA *vch;
  int local_20;
  CHAR_DATA *local_18;
  CHAR_DATA *local_10;
  
  local_18 = (CHAR_DATA *)0x0;
  local_20 = 0;
  for (local_10 = *(CHAR_DATA **)(in_RDI + 0x18); local_10 != (CHAR_DATA *)0x0;
      local_10 = local_10->next_in_room) {
    iVar1 = number_percent();
    if (local_20 < iVar1) {
      local_18 = local_10;
      local_20 = iVar1;
    }
  }
  return local_18;
}

Assistant:

CHAR_DATA *get_rand_from_room(ROOM_INDEX_DATA *room)
{
	CHAR_DATA *vch, *victim = nullptr;
	int now = 0, highest = 0;

	for (vch = room->people; vch; vch = vch->next_in_room)
	{
		if ((now = number_percent()) > highest)
		{
			victim = vch;
			highest = now;
		}
	}

	return victim;
}